

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O1

void __thiscall UKF::UpdateLidar(UKF *this,MeasurementPackage *meas_package)

{
  VectorXd *this_00;
  double **ppdVar1;
  double dVar2;
  uint uVar3;
  DenseIndex DVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  UKF *pUVar8;
  Index index;
  DenseStorage<double,__1,__1,__1,_0> *pDVar9;
  long lVar10;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar11;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  PlainObject *pPVar12;
  undefined8 *puVar13;
  Index index_2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar14;
  ulong uVar15;
  PlainObject *pPVar16;
  char *pcVar17;
  Index othersize;
  double *pdVar18;
  long lVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  DenseStorage<double,__1,__1,__1,_0> *pDVar23;
  ulong uVar24;
  Index size;
  bool bVar25;
  VectorXd z_pred;
  VectorXd z;
  MatrixXd S;
  MatrixXd Zsig;
  MatrixXd K;
  VectorXd z_diff;
  MatrixXd Tc;
  MatrixXd R;
  VectorXd x_diff;
  DenseStorage<double,__1,__1,_1,_0> local_170;
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_160;
  DenseStorage<double,__1,__1,_1,_0> local_128;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  DenseStorage<double,__1,__1,__1,_0> local_f8;
  DenseStorage<double,__1,__1,__1,_0> local_e0;
  undefined1 local_c8 [16];
  DenseStorage<double,__1,__1,__1,_0> local_b8;
  DenseStorage<double,__1,__1,__1,_0> local_98;
  DenseStorage<double,__1,__1,__1,_0> local_80;
  UKF *local_68;
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
  local_60;
  plain_array<double,_1,_0,_0> local_38;
  
  DVar4 = (meas_package->raw_measurements_).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_128,DVar4,DVar4,1);
  pDVar23 = (DenseStorage<double,__1,__1,__1,_0> *)
            (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)pDVar23 < 0) {
LAB_001067ea:
    pcVar17 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_001067ff;
  }
  if ((DenseStorage<double,__1,__1,__1,_0> *)local_128.m_rows != pDVar23) {
    free(local_128.m_data);
    if (pDVar23 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
      local_128.m_data = (double *)0x0;
    }
    else if (((ulong)pDVar23 >> 0x3d != 0) ||
            (local_128.m_data = (double *)malloc((long)pDVar23 * 8),
            local_128.m_data == (double *)0x0)) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = operator_delete;
      __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_128.m_rows = (DenseIndex)pDVar23;
  if (pDVar23 !=
      (DenseStorage<double,__1,__1,__1,_0> *)
      (meas_package->raw_measurements_).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    pcVar17 = 
    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_001067c9;
  }
  pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)((ulong)pDVar23 & 0x7ffffffffffffffe);
  if (1 < (long)pDVar23) {
    pDVar14 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
    do {
      pdVar18 = (meas_package->raw_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                (long)pDVar14;
      dVar2 = pdVar18[1];
      local_128.m_data[(long)pDVar14] = *pdVar18;
      (local_128.m_data + (long)pDVar14)[1] = dVar2;
      pDVar14 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar14->m_data + 2);
    } while (pDVar14 < pDVar9);
  }
  if ((long)pDVar9 < (long)pDVar23) {
    pdVar18 = (meas_package->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    do {
      local_128.m_data[(long)pDVar9] = pdVar18[(long)pDVar9];
      pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar9->m_data + 1);
    } while (pDVar23 != pDVar9);
  }
  uVar3 = this->n_aug_;
  local_f8.m_data = (double *)0x0;
  local_f8.m_rows = 0;
  local_f8.m_cols = 0;
  if ((int)uVar3 < 0) {
LAB_00106828:
    pcVar17 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_001067ff:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,pcVar17);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_f8,(ulong)uVar3 * 4 + 2,2,(ulong)uVar3 * 2 + 1);
  if (-1 < this->n_aug_) {
    lVar19 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    if (lVar19 < 1) {
LAB_0010671e:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x151,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                   );
    }
    uVar3 = this->n_aug_ * 2;
    uVar24 = 0;
    uVar15 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar15 = uVar24;
    }
    pdVar18 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data + 1;
    pdVar20 = local_f8.m_data + 1;
    do {
      if (((((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols <= (long)uVar24) || (lVar19 < 2)) || (local_f8.m_rows < 1)) ||
         (local_f8.m_cols <= (long)uVar24)) goto LAB_0010671e;
      dVar2 = *pdVar18;
      pdVar20[-1] = pdVar18[-1];
      if (local_f8.m_rows < 2) goto LAB_0010671e;
      *pdVar20 = dVar2;
      uVar24 = uVar24 + 1;
      pdVar18 = pdVar18 + lVar19;
      pdVar20 = pdVar20 + local_f8.m_rows;
    } while (uVar15 + 1 != uVar24);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_170,2,2,1);
  if (local_170.m_rows < 0) {
    pcVar17 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_001068f7;
  }
  if (1 < local_170.m_rows) {
    uVar15 = 0;
    do {
      local_170.m_data[uVar15] = 0.0;
      (local_170.m_data + uVar15)[1] = 0.0;
      uVar15 = uVar15 + 2;
    } while (uVar15 < (local_170.m_rows & 0x7ffffffffffffffeU));
  }
  if ((long)(local_170.m_rows & 0x7ffffffffffffffeU) < local_170.m_rows) {
    memset((void *)((local_170.m_rows << 3 & 0xfffffffffffffff0U) + (long)local_170.m_data),0,
           (ulong)((uint)(local_170.m_rows << 3) & 8));
  }
  if (-1 < this->n_aug_) {
    lVar10 = 0;
    lVar19 = 0;
    do {
      if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar19) goto LAB_00106795;
      if ((local_f8.m_rows < 0) && (local_f8.m_data + local_f8.m_rows * lVar19 != (double *)0x0))
      goto LAB_0010675c;
      if (local_f8.m_cols <= lVar19) goto LAB_0010673d;
      if (local_170.m_rows != local_f8.m_rows) {
        pcVar17 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
        ;
        goto LAB_0010681e;
      }
      if (local_f8.m_rows < 0) goto LAB_001067ea;
      dVar2 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data[lVar19];
      local_170.m_rows = local_f8.m_rows;
      pDVar23 = (DenseStorage<double,__1,__1,__1,_0> *)(local_f8.m_rows & 0x7ffffffffffffffe);
      if (1 < local_f8.m_rows) {
        pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
        do {
          dVar6 = (local_170.m_data + (long)pDVar9)[1];
          pdVar18 = (double *)((long)local_f8.m_data + (long)pDVar9 * 8 + local_f8.m_rows * lVar10);
          dVar7 = pdVar18[1];
          local_170.m_data[(long)pDVar9] = *pdVar18 * dVar2 + local_170.m_data[(long)pDVar9];
          (local_170.m_data + (long)pDVar9)[1] = dVar7 * dVar2 + dVar6;
          pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar9->m_data + 2);
        } while (pDVar9 < pDVar23);
      }
      if ((long)pDVar23 < local_f8.m_rows) {
        do {
          local_170.m_data[(long)pDVar23] =
               *(double *)((long)local_f8.m_data + (long)pDVar23 * 8 + local_f8.m_rows * lVar10) *
               dVar2 + local_170.m_data[(long)pDVar23];
          pDVar23 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar23->m_data + 1);
        } while ((DenseStorage<double,__1,__1,__1,_0> *)local_f8.m_rows != pDVar23);
      }
      lVar10 = lVar10 + 8;
      bVar25 = SBORROW8(lVar19,(long)this->n_aug_ * 2);
      lVar21 = lVar19 + (long)this->n_aug_ * -2;
      lVar19 = lVar19 + 1;
    } while (bVar25 != lVar21 < 0);
  }
  local_118.m_data = (double *)0x0;
  local_118.m_rows = 0;
  local_118.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_118,4,2,2);
  local_160.m_lhs = (LhsNested)local_118.m_rows;
  local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_118.m_cols;
  local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  if (-1 < (local_118.m_cols | local_118.m_rows)) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_118,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_160);
    local_68 = this;
    if (-1 < this->n_aug_) {
      lVar10 = 0;
      lVar19 = 0;
      do {
        DVar4 = local_f8.m_rows;
        pdVar18 = local_f8.m_data;
        if ((local_f8.m_rows < 0) && (local_f8.m_data + local_f8.m_rows * lVar19 != (double *)0x0))
        goto LAB_0010675c;
        if (local_f8.m_cols <= lVar19) goto LAB_0010673d;
        if (local_f8.m_rows != local_170.m_rows) goto LAB_001067d3;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_98,local_170.m_rows,local_170.m_rows
                   ,1);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_98,
                   local_170.m_rows,1);
        if (local_98.m_rows != local_170.m_rows) goto LAB_001067b4;
        pDVar23 = (DenseStorage<double,__1,__1,__1,_0> *)
                  (local_98.m_rows - (local_98.m_rows >> 0x3f) & 0xfffffffffffffffe);
        if (1 < local_98.m_rows) {
          lVar21 = 0;
          do {
            pdVar20 = (double *)((long)pdVar18 + lVar21 * 8 + DVar4 * lVar10);
            dVar2 = pdVar20[1];
            dVar6 = (local_170.m_data + lVar21)[1];
            local_98.m_data[lVar21] = *pdVar20 - local_170.m_data[lVar21];
            (local_98.m_data + lVar21)[1] = dVar2 - dVar6;
            lVar21 = lVar21 + 2;
          } while (lVar21 < (long)pDVar23);
        }
        if ((long)pDVar23 < local_98.m_rows) {
          do {
            local_98.m_data[(long)pDVar23] =
                 *(double *)((long)pdVar18 + (long)pDVar23 * 8 + DVar4 * lVar10) -
                 local_170.m_data[(long)pDVar23];
            pDVar23 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar23->m_data + 1);
          } while ((DenseStorage<double,__1,__1,__1,_0> *)local_98.m_rows != pDVar23);
        }
        if ((local_68->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar19) goto LAB_00106795;
        local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)
                 (local_68->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 .m_storage.m_data[lVar19];
        local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = 0;
        local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_data = (double *)0x0;
        local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_rows = 0;
        local_160.m_lhs = (LhsNested)&local_98;
        local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows = (DenseIndex)&local_98;
        local_60.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_lhs = (LhsNested)&local_118;
        local_60.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160);
        if (((DenseStorage<double,__1,__1,__1,_0> *)local_118.m_rows !=
             *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_160.m_lhs + 8)) ||
           ((DenseStorage<double,__1,__1,__1,_0> *)local_118.m_cols !=
            *(DenseStorage<double,__1,__1,__1,_0> **)
             (local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows + 8))) goto LAB_0010677b;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_118,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                    *)&local_60);
        free((void *)local_160.m_rhs.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols);
        free(local_98.m_data);
        lVar10 = lVar10 + 8;
        bVar25 = SBORROW8(lVar19,(long)local_68->n_aug_ * 2);
        lVar21 = lVar19 + (long)local_68->n_aug_ * -2;
        lVar19 = lVar19 + 1;
      } while (bVar25 != lVar21 < 0);
    }
    local_98.m_data = (double *)0x0;
    local_98.m_rows = 0;
    local_98.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_98,4,2,2);
    pUVar8 = local_68;
    local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 1;
    local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = 1;
    *local_98.m_data = local_68->std_laspx_ * local_68->std_laspx_;
    local_60.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_lhs = (LhsNested)0x0;
    local_160.m_lhs = (LhsNested)&local_98;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_160,
                         (Scalar *)&local_60);
    local_b8.m_data = (double *)0x0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,(Scalar *)(local_c8 + 0x10));
    local_e0.m_data = (double *)(pUVar8->std_laspy_ * pUVar8->std_laspy_);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar11,(Scalar *)&local_e0);
    if (((local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols + (long)local_160.m_rhs.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data != *(DenseIndex *)((long)local_160.m_lhs + 8)) &&
        (*(DenseIndex *)((long)local_160.m_lhs + 0x10) != 0)) ||
       ((DenseStorage<double,__1,__1,__1,_0> *)
        local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows != *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_160.m_lhs + 0x10))) {
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CommaInitializer.h"
                    ,0x6f,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_160.m_lhs = (LhsNested)&local_118;
    local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_98;
    if ((local_118.m_rows != local_98.m_rows) || (local_118.m_cols != local_98.m_cols)) {
      pcVar17 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_0010681e;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_118,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_160);
    local_b8.m_data = (double *)0x0;
    local_b8.m_rows = 0;
    local_b8.m_cols = 0;
    lVar19 = (long)pUVar8->n_x_;
    if (lVar19 < 0) goto LAB_00106828;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)(local_c8 + 0x10),lVar19 * 2,lVar19,2);
    local_160.m_lhs = (LhsNested)local_b8.m_rows;
    local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_b8.m_cols;
    local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 0;
    if (-1 < (local_b8.m_cols | local_b8.m_rows)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_c8 + 0x10),
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_160);
      if (-1 < pUVar8->n_aug_) {
        lVar10 = 0;
        lVar19 = 0;
        do {
          DVar4 = local_f8.m_rows;
          pdVar18 = local_f8.m_data;
          if ((local_f8.m_rows < 0) && (local_f8.m_data + local_f8.m_rows * lVar19 != (double *)0x0)
             ) {
LAB_0010675c:
            __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/MapBase.h"
                          ,0x94,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                         );
          }
          if (local_f8.m_cols <= lVar19) {
LAB_0010673d:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Block.h"
                          ,0x76,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                         );
          }
          if (local_f8.m_rows != local_170.m_rows) goto LAB_001067d3;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_e0,local_170.m_rows,
                     local_170.m_rows,1);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e0,
                     local_170.m_rows,1);
          if (local_e0.m_rows != local_170.m_rows) goto LAB_001067b4;
          pDVar23 = (DenseStorage<double,__1,__1,__1,_0> *)
                    (local_e0.m_rows - (local_e0.m_rows >> 0x3f) & 0xfffffffffffffffe);
          if (1 < local_e0.m_rows) {
            lVar21 = 0;
            do {
              pdVar20 = (double *)((long)pdVar18 + lVar21 * 8 + DVar4 * lVar10);
              dVar2 = pdVar20[1];
              dVar6 = (local_170.m_data + lVar21)[1];
              local_e0.m_data[lVar21] = *pdVar20 - local_170.m_data[lVar21];
              (local_e0.m_data + lVar21)[1] = dVar2 - dVar6;
              lVar21 = lVar21 + 2;
            } while (lVar21 < (long)pDVar23);
          }
          if ((long)pDVar23 < local_e0.m_rows) {
            do {
              local_e0.m_data[(long)pDVar23] =
                   *(double *)((long)pdVar18 + (long)pDVar23 * 8 + DVar4 * lVar10) -
                   local_170.m_data[(long)pDVar23];
              pDVar23 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar23->m_data + 1);
            } while ((DenseStorage<double,__1,__1,__1,_0> *)local_e0.m_rows != pDVar23);
          }
          pdVar18 = (pUVar8->Xsig_pred_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data;
          lVar21 = (pUVar8->Xsig_pred_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          if ((lVar21 < 0) && (pdVar18 + lVar21 * lVar19 != (double *)0x0)) goto LAB_0010675c;
          if ((pUVar8->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar19) goto LAB_0010673d;
          lVar22 = (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (lVar21 != lVar22) goto LAB_001067d3;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_80,lVar22,lVar22,1);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_80,
                     (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows,1);
          if ((PlainObject *)local_80.m_rows !=
              (PlainObject *)
              (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows) goto LAB_001067b4;
          pPVar16 = (PlainObject *)
                    (local_80.m_rows - (local_80.m_rows >> 0x3f) & 0xfffffffffffffffe);
          if (1 < local_80.m_rows) {
            lVar22 = 0;
            do {
              pdVar20 = (double *)((long)pdVar18 + lVar22 * 8 + lVar21 * lVar10);
              dVar2 = pdVar20[1];
              pdVar5 = (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar22;
              dVar6 = pdVar5[1];
              ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          local_80.m_data)->m_storage).m_data + lVar22;
              *ppdVar1 = (double *)(*pdVar20 - *pdVar5);
              ppdVar1[1] = (double *)(dVar2 - dVar6);
              lVar22 = lVar22 + 2;
            } while (lVar22 < (long)pPVar16);
          }
          if ((long)pPVar16 < local_80.m_rows) {
            pdVar20 = (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data;
            do {
              (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_80.m_data)->
                m_storage).m_data)[(long)pPVar16] =
                   (double *)
                   (*(double *)((long)pdVar18 + (long)pPVar16 * 8 + lVar21 * lVar10) -
                   pdVar20[(long)pPVar16]);
              pPVar16 = (PlainObject *)
                        ((long)&(pPVar16->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                m_storage.m_data + 1);
            } while ((PlainObject *)local_80.m_rows != pPVar16);
          }
          if ((pUVar8->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar19) {
LAB_00106795:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x18a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)
                    (pUVar8->weights_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    [lVar19];
          local_160.m_lhs = (LhsNested)&local_80;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows = (DenseIndex)&local_e0;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = 0;
          local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_data = (double *)0x0;
          local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows = 0;
          local_60.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_lhs = (LhsNested)(local_c8 + 0x10);
          local_60.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160);
          if (((DenseStorage<double,__1,__1,__1,_0> *)local_b8.m_rows !=
               *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_160.m_lhs + 8)) ||
             ((DenseStorage<double,__1,__1,__1,_0> *)local_b8.m_cols !=
              *(DenseStorage<double,__1,__1,__1,_0> **)
               (local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows + 8))) goto LAB_0010677b;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_c8 + 0x10),
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                      *)&local_60);
          free((void *)local_160.m_rhs.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols);
          free(local_80.m_data);
          free(local_e0.m_data);
          lVar10 = lVar10 + 8;
          bVar25 = SBORROW8(lVar19,(long)pUVar8->n_aug_ * 2);
          lVar21 = lVar19 + (long)pUVar8->n_aug_ * -2;
          lVar19 = lVar19 + 1;
        } while (bVar25 != lVar21 < 0);
      }
      if (local_118.m_rows == local_118.m_cols) {
        local_60.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_lhs = (LhsNested)&local_118;
        Eigen::
        ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
        ::ProductBase(&local_160,(Matrix<double,__1,__1,_0,__1,__1> *)(local_c8 + 0x10),
                      (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)&local_60);
        other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_e0,*(long *)(other + 0x10) * *(long *)(other + 8),*(long *)(other + 8),
                   *(long *)(other + 0x10));
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e0,other);
        free(local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        free(local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        if (local_128.m_rows != local_170.m_rows) {
          pcVar17 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_0010681e;
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)local_c8,local_170.m_rows,local_170.m_rows,
                   1);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_c8,
                   local_170.m_rows,1);
        if (local_c8._8_8_ != local_170.m_rows) {
          pcVar17 = 
          "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_001067c9;
        }
        pDVar23 = (DenseStorage<double,__1,__1,__1,_0> *)
                  (local_c8._8_8_ - ((long)local_c8._8_8_ >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)local_c8._8_8_) {
          lVar19 = 0;
          do {
            dVar2 = (local_128.m_data + lVar19)[1];
            dVar6 = (local_170.m_data + lVar19)[1];
            *(double *)(local_c8._0_8_ + lVar19 * 8) =
                 local_128.m_data[lVar19] - local_170.m_data[lVar19];
            ((double *)(local_c8._0_8_ + lVar19 * 8))[1] = dVar2 - dVar6;
            lVar19 = lVar19 + 2;
          } while (lVar19 < (long)pDVar23);
        }
        if ((long)pDVar23 < (long)local_c8._8_8_) {
          do {
            *(double *)(local_c8._0_8_ + pDVar23 * 8) =
                 local_128.m_data[(long)pDVar23] - local_170.m_data[(long)pDVar23];
            pDVar23 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar23->m_data + 1);
          } while ((DenseStorage<double,__1,__1,__1,_0> *)local_c8._8_8_ != pDVar23);
        }
        local_80.m_data = (double *)local_c8;
        if (local_118.m_rows == local_118.m_cols) {
          local_38.array[0] = (double  [1])(double  [1])&local_118;
          Eigen::
          ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                         *)&local_160,
                        (Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_80,
                        (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)&local_38);
          Eigen::
          GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>
          ::GeneralProduct((GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3>
                            *)&local_60,
                           (GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>
                            *)&local_160,(Matrix<double,__1,_1,_0,__1,_1> *)local_c8);
          pUVar8->NIS_laser_ =
               (double)local_60.
                       super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_lhs;
          free(local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data);
          free(local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data);
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows = 0;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = 0;
          local_160.m_lhs = (LhsNested)&local_e0;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)local_c8;
          if (local_e0.m_cols != local_c8._8_8_) {
            pcVar17 = 
            "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>]"
            ;
LAB_00106995:
            __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/ProductBase.h"
                          ,0x66,pcVar17);
          }
          pPVar12 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160);
          if ((pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows == *(DenseIndex *)((long)local_160.m_lhs + 8)) {
            this_00 = &pUVar8->x_;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       (pPVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows,1);
            uVar15 = (pUVar8->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if (uVar15 != (pPVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_rows) {
              pcVar17 = 
              "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>]"
              ;
              goto LAB_001067c9;
            }
            uVar24 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar15) {
              lVar19 = 0;
              do {
                pdVar5 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                pdVar18 = pdVar5 + lVar19;
                dVar6 = pdVar18[1];
                pdVar20 = (pPVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data + lVar19;
                dVar2 = pdVar20[1];
                pdVar5 = pdVar5 + lVar19;
                *pdVar5 = *pdVar18 + *pdVar20;
                pdVar5[1] = dVar6 + dVar2;
                lVar19 = lVar19 + 2;
              } while (lVar19 < (long)uVar24);
            }
            if ((long)uVar24 < (long)uVar15) {
              pdVar18 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              pdVar20 = (pPVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              do {
                pdVar18[uVar24] = pdVar18[uVar24] + pdVar20[uVar24];
                uVar24 = uVar24 + 1;
              } while (uVar15 != uVar24);
            }
            free((void *)local_160.m_rhs.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows);
            local_60.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (double *)0x0;
            local_60.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = 0;
            local_60.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols = 0;
            local_60.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_lhs = (LhsNested)&local_e0;
            local_60.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_rhs = (RhsNested)&local_118;
            if (local_e0.m_cols != local_118.m_rows) {
              pcVar17 = 
              "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>]"
              ;
              goto LAB_00106995;
            }
            local_38.array[0] = (double  [1])(double  [1])&local_e0;
            Eigen::
            ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&local_160,&local_60,
                          (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_38);
            local_80.m_data = (double *)&pUVar8->P_;
            local_80.m_rows =
                 (DenseIndex)Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160)
            ;
            if (((pUVar8->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows == *(DenseIndex *)((long)local_160.m_lhs + 8)) &&
               ((pUVar8->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols ==
                *(DenseIndex *)
                 ((long)local_160.m_rhs.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data + 8))) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
              lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&pUVar8->P_,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>_>
                          *)&local_80);
              free((void *)local_160.m_rhs.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows);
              free(local_60.
                   super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free((void *)local_c8._0_8_);
              free(local_e0.m_data);
              free(local_b8.m_data);
              free(local_98.m_data);
              free(local_118.m_data);
              free(local_170.m_data);
              free(local_f8.m_data);
              free(local_128.m_data);
              return;
            }
            pcVar17 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>]"
            ;
          }
          else {
            pcVar17 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>]"
            ;
          }
          goto LAB_0010681e;
        }
      }
      __assert_fail("rows() == cols()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/LU/Inverse.h"
                    ,0x143,
                    "const internal::inverse_impl<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
  }
  local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  pcVar17 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_001068f7:
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,pcVar17);
LAB_001067d3:
  pcVar17 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_0010681e;
LAB_001067b4:
  pcVar17 = 
  "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>]"
  ;
LAB_001067c9:
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Assign.h"
                ,0x1f9,pcVar17);
LAB_0010677b:
  pcVar17 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
  ;
LAB_0010681e:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x84,pcVar17);
}

Assistant:

void UKF::UpdateLidar(MeasurementPackage meas_package) {
  /**
  TODO:
  Complete this function! Use lidar data to update the belief about the object's
  position. Modify the state vector, x_, and covariance, P_.
  You'll also need to calculate the lidar NIS.
  */

  //extract measurement as VectorXd
  VectorXd z = meas_package.raw_measurements_;

  //set measurement dimension, lidar can measure p_x and p_y
  int n_z = 2;

  //create matrix for sigma points in measurement space
  MatrixXd Zsig = MatrixXd(n_z, 2 * n_aug_ + 1);

  //transform sigma points into measurement space
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    // extract values for better readibility
    double p_x = Xsig_pred_(0, i);
    double p_y = Xsig_pred_(1, i);

    // measurement model
    Zsig(0, i) = p_x;
    Zsig(1, i) = p_y;
  }

  //mean predicted measurement
  VectorXd z_pred = VectorXd(n_z);
  z_pred.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {
    z_pred = z_pred + weights_(i) * Zsig.col(i);
  }

  //measurement covariance matrix S
  MatrixXd S = MatrixXd(n_z, n_z);
  S.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    //residual
    VectorXd z_diff = Zsig.col(i) - z_pred;

    S = S + weights_(i) * z_diff * z_diff.transpose();
  }

  //add measurement noise covariance matrix
  MatrixXd R = MatrixXd(n_z, n_z);
  R << std_laspx_*std_laspx_, 0,
       0, std_laspy_*std_laspy_;
  S = S + R;

  //create matrix for cross correlation Tc
  MatrixXd Tc = MatrixXd(n_x_, n_z);

  /*****************************************************************************
  *  UKF Update for Lidar
  ****************************************************************************/
  //calculate cross correlation matrix
  Tc.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    //residual
    VectorXd z_diff = Zsig.col(i) - z_pred;

    // state difference
    VectorXd x_diff = Xsig_pred_.col(i) - x_;

    Tc = Tc + weights_(i) * x_diff * z_diff.transpose();
  }

  //Kalman gain K;
  MatrixXd K = Tc * S.inverse();

  //residual
  VectorXd z_diff = z - z_pred;

  //calculate NIS
  NIS_laser_ = z_diff.transpose() * S.inverse() * z_diff;

  //update state mean and covariance matrix
  x_ = x_ + K * z_diff;
  P_ = P_ - K*S*K.transpose();

}